

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O2

Token * __thiscall
Tokenizer::parseString(Token *__return_storage_ptr__,Tokenizer *this,char closing)

{
  bool bVar1;
  _Optional_base<char,_true,_true> _Var2;
  TokenizerException *pTVar3;
  allocator<char> local_d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string res;
  _Variant_storage<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
  local_50;
  
  res._M_dataplus._M_p = (pointer)&res.field_2;
  res._M_string_length = 0;
  res.field_2._M_local_buf[0] = '\0';
  _Var2._M_payload.super__Optional_payload_base<char> =
       (_Optional_payload<char,_true,_true,_true>)next(this);
  if (((ushort)_Var2._M_payload.super__Optional_payload_base<char> >> 8 & 1) == 0) {
    pTVar3 = (TokenizerException *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,"Expected closing ",&local_d1);
    std::operator+(&local_b0,&local_d0,closing);
    std::operator+(&local_90,&local_b0,", got EOF");
    TokenizerException::TokenizerException
              (pTVar3,&local_90,this->line_number,this->col_number,&this->current_line);
    __cxa_throw(pTVar3,&TokenizerException::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = false;
  do {
    if (bVar1) {
      doBackslash(_Var2._M_payload.super__Optional_payload_base<char>._M_payload);
LAB_00106dd3:
      std::__cxx11::string::push_back((char)&res);
      bVar1 = false;
    }
    else {
      bVar1 = true;
      if (_Var2._M_payload.super__Optional_payload_base<char>._M_payload != '\\') goto LAB_00106dd3;
    }
    _Var2._M_payload.super__Optional_payload_base<char> =
         (_Optional_payload<char,_true,_true,_true>)next(this);
    if (((ushort)_Var2._M_payload.super__Optional_payload_base<char> >> 8 & 1) == 0) {
      pTVar3 = (TokenizerException *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d0,"Expected closing ",&local_d1);
      std::operator+(&local_b0,&local_d0,closing);
      std::operator+(&local_90,&local_b0,", got EOF");
      TokenizerException::TokenizerException
                (pTVar3,&local_90,this->line_number,this->col_number,&this->current_line);
      __cxa_throw(pTVar3,&TokenizerException::typeinfo,std::runtime_error::~runtime_error);
    }
    if (!(bool)(_Var2._M_payload.super__Optional_payload_base<char>._M_payload != closing | bVar1))
    {
      next(this);
      std::__detail::__variant::_Variant_storage<false,int,double,std::__cxx11::string,bool,char>::
      _Variant_storage<2ul,std::__cxx11::string&>
                ((_Variant_storage<false,int,double,std::__cxx11::string,bool,char> *)&local_50,&res
                );
      __return_storage_ptr__->type = String;
      std::__detail::__variant::
      _Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
      ::_Move_ctor_base((_Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                         *)&__return_storage_ptr__->value,
                        (_Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                         *)&local_50);
      std::__detail::__variant::
      _Variant_storage<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
      ::~_Variant_storage(&local_50);
      std::__cxx11::string::~string((string *)&res);
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

Token Tokenizer::parseString(char closing) {
    string res;
    char c;
    optional<char> _;
    _ = next();
    if (!_.has_value()) {
        throw TokenizerException(string("Expected closing ") + closing + ", got EOF", line_number, col_number,
                                 current_line);
    }
    c = _.value();
    bool backslash = false;
    do {
        if (backslash) {
            backslash = false;
            res += doBackslash(c);
        } else {
            if (c == '\\')
                backslash = true;
            else {
                backslash = false;
                res += c;
            }
        }
        _ = next();
        if (!_.has_value()) {
            throw TokenizerException(string("Expected closing ") + closing + ", got EOF", line_number, col_number,
                                     current_line);
        }
        c = _.value();
    } while (c != closing || backslash);
    next();
    return Token(String, res);
}